

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUITab::CGUITab
          (CGUITab *this,IGUIEnvironment *environment,IGUIElement *parent,rect<int> *rectangle,
          s32 id)

{
  rect<int> rectangle_00;
  undefined4 uVar1;
  undefined8 *puVar2;
  vector2d<int> in_RCX;
  vector2d<int> in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  IGUISkin *skin;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  IGUIEnvironment *in_stack_ffffffffffffffc0;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 0x29));
  rectangle_00.LowerRightCorner = in_RDX;
  rectangle_00.UpperLeftCorner = in_RCX;
  IGUITab::IGUITab(*(IGUITab **)((long)in_RCX + 8),*(void ***)in_RCX,in_stack_ffffffffffffffc0,
                   (IGUIElement *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   (s32)((ulong)in_RDI >> 0x20),rectangle_00);
  *in_RDI = 0x448838;
  in_RDI[0x29] = 0x4489a0;
  video::SColor::SColor((SColor *)((long)in_RDI + 0x134),0,0,0,0);
  *(undefined1 *)(in_RDI + 0x27) = 0;
  video::SColor::SColor((SColor *)((long)in_RDI + 0x13c),0xff,0,0,0);
  *(undefined1 *)(in_RDI + 0x28) = 0;
  puVar2 = (undefined8 *)(**(code **)(*in_RSI + 0x60))();
  if (puVar2 != (undefined8 *)0x0) {
    uVar1 = (**(code **)*puVar2)(puVar2,8);
    *(undefined4 *)((long)in_RDI + 0x13c) = uVar1;
  }
  return;
}

Assistant:

CGUITab::CGUITab(IGUIEnvironment *environment,
		IGUIElement *parent, const core::rect<s32> &rectangle,
		s32 id) :
		IGUITab(environment, parent, id, rectangle),
		BackColor(0, 0, 0, 0), OverrideTextColorEnabled(false), TextColor(255, 0, 0, 0),
		DrawBackground(false)
{
#ifdef _DEBUG
	setDebugName("CGUITab");
#endif

	const IGUISkin *const skin = environment->getSkin();
	if (skin)
		TextColor = skin->getColor(EGDC_BUTTON_TEXT);
}